

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::~Array2D(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
           *this)

{
  memory_resource *pmVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
          (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) *
          ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
          (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x);
  for (lVar3 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18)
  {
    std::
    _Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
    ::~_Vector_base((_Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                     *)((long)&(this->values->
                               super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar3));
  }
  pmVar1 = (this->allocator).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->values,(long)(int)uVar2 * 0x18,8);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }